

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O2

int testIsChild(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  allocator<char> local_7a;
  allocator<char> local_79;
  byte local_78;
  byte local_77;
  byte local_76;
  byte local_75;
  int local_74;
  string local_70;
  string local_50;
  
  bVar1 = true;
  iVar4 = 0;
  while (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary/",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary",&local_7a);
    iVar2 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," result=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary/",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary",&local_7a);
    iVar3 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary/",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary/Egret",&local_7a);
    local_74 = (iVar4 + 1) - (uint)(iVar2 == 0);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    local_75 = iVar4 != 1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,"/Norman/Bird/Sanctuary/Egret");
    poVar5 = std::operator<<(poVar5," result=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary/",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary/Egret",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary/Egret/Baby",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    local_76 = iVar4 != 2;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,"/Norman/Bird/Sanctuary/Egret/Baby");
    poVar5 = std::operator<<(poVar5," result=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Sanctuary/Egret/Baby",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Egret",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    local_77 = iVar4 != -1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,"/Norman/Bird/Egret");
    poVar5 = std::operator<<(poVar5," result=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"/Norman/Bird/Egret",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"hello darling",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    local_78 = iVar4 != -1;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    poVar5 = std::operator<<((ostream *)&std::cout,"/Norman/Bird/Sanctuary");
    poVar5 = std::operator<<(poVar5," to ");
    poVar5 = std::operator<<(poVar5,"hello darling");
    poVar5 = std::operator<<(poVar5," result=");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"/Norman/Bird/Sanctuary",&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"hello darling",&local_7a);
    iVar4 = MinVR::VRDataIndex::isChild(&local_50,&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = (uint)local_78 + (uint)local_77 + (uint)local_76 + local_74 + (uint)local_75;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = false;
  }
  return iVar4;
}

Assistant:

int testIsChild() {

  int out = 0;

  LOOP {
    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary") == 0) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                        "/Norman/Bird/Sanctuary/Egret") == 1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary/",
                                             "/Norman/Bird/Sanctuary/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Sanctuary/Egret/Baby") == 2) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Sanctuary/Egret/Baby"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Sanctuary/Egret/Baby")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "/Norman/Bird/Egret") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "/Norman/Bird/Egret"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "/Norman/Bird/Egret")
              << std::endl;

    out += (MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                        "hello darling") == -1) ? 0 : 1;
    std::cout << "/Norman/Bird/Sanctuary"
              << " to "
              << "hello darling"
              << " result="
              << MinVR::VRDataIndex::isChild("/Norman/Bird/Sanctuary",
                                             "hello darling")
              << std::endl;
  }